

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall GlobOpt::TryOptimizeInstrWithFixedDataProperty(GlobOpt *this,Instr **pInstr)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  SymOpnd *this_01;
  
  if (pInstr == (Instr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xe74,"(pInstr)","pInstr");
    if (!bVar2) goto LAB_0042c32f;
    *puVar3 = 0;
  }
  this_00 = (*pInstr)->m_src1;
  if (this_00 != (Opnd *)0x0) {
    bVar2 = IR::Opnd::IsSymOpnd(this_00);
    if (bVar2) {
      this_01 = IR::Opnd::AsSymOpnd(this_00);
      bVar2 = IR::SymOpnd::IsPropertySymOpnd(this_01);
      if (bVar2) goto LAB_0042c2af;
    }
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                     ,0xe77,"(src1 && src1->IsSymOpnd() && src1->AsSymOpnd()->IsPropertySymOpnd())",
                     "src1 && src1->IsSymOpnd() && src1->AsSymOpnd()->IsPropertySymOpnd()");
  if (!bVar2) {
LAB_0042c32f:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_0042c2af:
  sourceContextId = Func::GetSourceContextId((*pInstr)->m_func);
  functionId = Func::GetLocalFunctionId((*pInstr)->m_func);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,UseFixedDataPropsPhase,sourceContextId,functionId);
  if (((!bVar2) && (this->prePassLoop == (Loop *)0x0)) && ((this->field_0xf4 & 0x20) == 0)) {
    bVar2 = OpCodeAttr::CanLoadFixedFields((*pInstr)->m_opcode);
    if (bVar2) {
      IR::Instr::TryOptimizeInstrWithFixedDataProperty(*pInstr,pInstr,this);
      return;
    }
  }
  return;
}

Assistant:

void
GlobOpt::TryOptimizeInstrWithFixedDataProperty(IR::Instr ** const pInstr)
{
    Assert(pInstr);
    IR::Instr * &instr = *pInstr;
    IR::Opnd * src1 = instr->GetSrc1();
    Assert(src1 && src1->IsSymOpnd() && src1->AsSymOpnd()->IsPropertySymOpnd());

    if(PHASE_OFF(Js::UseFixedDataPropsPhase, instr->m_func))
    {
        return;
    }

    if (!this->IsLoopPrePass() && !this->isRecursiveCallOnLandingPad &&
        OpCodeAttr::CanLoadFixedFields(instr->m_opcode))
    {
        instr->TryOptimizeInstrWithFixedDataProperty(&instr, this);
    }
}